

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.hpp
# Opt level: O0

optional<helics::ActionMessage> * __thiscall
gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::try_pop
          (BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this)

{
  bool bVar1;
  long in_RSI;
  optional<helics::ActionMessage> *in_RDI;
  optional<helics::ActionMessage> *this_00;
  lock_guard<std::mutex> pullLock;
  optional<helics::ActionMessage> *val;
  ActionMessage *in_stack_ffffffffffffffa8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffb0;
  optional<helics::ActionMessage> *this_01;
  BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
  *in_stack_ffffffffffffffe0;
  
  this_01 = in_RDI;
  CLI::std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffffb0,(mutex_type *)in_stack_ffffffffffffffa8);
  checkPullAndSwap(in_stack_ffffffffffffffe0);
  bVar1 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::empty
                    ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                     this_01);
  if (bVar1) {
    std::optional<helics::ActionMessage>::optional(in_RDI);
  }
  else {
    this_00 = (optional<helics::ActionMessage> *)(in_RSI + 0x68);
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)this_00);
    std::optional<helics::ActionMessage>::optional<helics::ActionMessage,_true>
              (this_00,in_stack_ffffffffffffffa8);
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::pop_back
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x4ac2fc);
    checkPullAndSwap(in_stack_ffffffffffffffe0);
  }
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x4ac34e);
  return this_01;
}

Assistant:

std::optional<T> BlockingQueue<T, MUTEX, COND>::try_pop()
    {
        std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
        checkPullAndSwap();
        if (pullElements.empty()) {
            return std::nullopt;
        }
        std::optional<T> val(
            std::move(pullElements.back()));  // do it this way to allow
                                              // movable only types
        pullElements.pop_back();
        checkPullAndSwap();
        return val;
    }